

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::PushTarget(SQFuncState *this,SQInteger n)

{
  SQFuncState *local_20;
  SQInteger n_local;
  SQFuncState *this_local;
  
  local_20 = (SQFuncState *)n;
  n_local = (SQInteger)this;
  if (n == -1) {
    local_20 = (SQFuncState *)AllocStackPos(this);
    sqvector<long_long>::push_back(&this->_targetstack,(longlong *)&local_20);
    this_local = local_20;
  }
  else {
    sqvector<long_long>::push_back(&this->_targetstack,(longlong *)&local_20);
    this_local = local_20;
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQFuncState::PushTarget(SQInteger n)
{
    if(n!=-1){
        _targetstack.push_back(n);
        return n;
    }
    n=AllocStackPos();
    _targetstack.push_back(n);
    return n;
}